

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

string * __thiscall
hdc::Graph<int>::to_dot_abi_cxx11_(string *__return_storage_ptr__,Graph<int> *this)

{
  char *__s;
  ostream *poVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> colors;
  stringstream ss;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_218;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_1e8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_1e8,&(this->assignedColors)._M_t);
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"graph G {\n",10);
  p_Var4 = (this->graph)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->graph)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    ",4);
      poVar1 = (ostream *)std::ostream::operator<<(local_1a8,p_Var4[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," [color=",8);
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_1e8,(key_type *)(p_Var4 + 1));
      __s = (&PTR_anon_var_dwarf_235514_00199d40)[*pmVar2];
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
    p_Var4 = (this->graph)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    do {
      for (p_Var6 = *(_Rb_tree_node_base **)(p_Var4 + 2);
          p_Var6 != (_Rb_tree_node_base *)&p_Var4[1]._M_left;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_218,
                           (key_type *)(p_Var6 + 1));
        if (sVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    ",4);
          poVar1 = (ostream *)std::ostream::operator<<(local_1a8,p_Var4[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," -- ",4);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var6[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_218,(int *)(p_Var4 + 1));
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_218);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_dot() {
            std::stringstream ss;
            std::map<T, int> colors = assignedColors;

            std::set<T> nodes;
            char const *cc[] = {
                "black",
                "red",
                "blue",
                "green",
                "yellow",
                "pink",
                "dimgray",
                "darkviolet",
                "gold2",
                "navyblue",
                "tomato",
                "coral4"
            };

            ss << "graph G {\n";

            typename std::map<T, std::set<T> >::iterator it;
            typename std::set<T>::iterator it2;

            for (it = graph.begin(); it != graph.end(); ++it) {
                ss << "    " << it->first << " [color=" << cc[colors[it->first]] << "];\n";
            }

            for (it = graph.begin(); it != graph.end(); ++it) {
                for (it2 = it->second.begin(); it2 != it->second.end(); ++it2) {
                    if (nodes.count(*it2) == 0) {
                        ss << "    " << it->first << " -- " << *it2 << ";\n";
                    }
                }

                nodes.insert(it->first);
            }

            ss << "}\n";
            return ss.str();
        }